

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOPinData.cpp
# Opt level: O1

vector<GPIO::PinDefinition,_std::allocator<GPIO::PinDefinition>_> *
GPIO::EntirePinData::_JETSON_NANO_PIN_DEFS(void)

{
  long lVar1;
  vector<GPIO::PinDefinition,_std::allocator<GPIO::PinDefinition>_> *in_RDI;
  initializer_list<GPIO::PinDefinition> __l;
  allocator_type local_2601;
  string local_2600;
  string local_25e0;
  string local_25c0;
  string local_25a0;
  string local_2580;
  string local_2560;
  string local_2540;
  string local_2520;
  string local_2500;
  string local_24e0;
  string local_24c0;
  string local_24a0;
  string local_2480;
  string local_2460;
  string local_2440;
  string local_2420;
  string local_2400;
  string local_23e0;
  string local_23c0;
  string local_23a0;
  string local_2380;
  string local_2360;
  string local_2340;
  string local_2320;
  string local_2300;
  string local_22e0;
  string local_22c0;
  string local_22a0;
  string local_2280;
  string local_2260;
  string local_2240;
  string local_2220;
  string local_2200;
  string local_21e0;
  string local_21c0;
  string local_21a0;
  string local_2180;
  string local_2160;
  string local_2140;
  string local_2120;
  string local_2100;
  string local_20e0;
  string local_20c0;
  string local_20a0;
  undefined1 local_2080 [176];
  _Alloc_hider local_1fd0;
  char local_1fc0 [16];
  _Alloc_hider local_1fb0;
  char local_1fa0 [16];
  _Alloc_hider local_1f90;
  char local_1f80 [16];
  _Alloc_hider local_1f70;
  char local_1f60 [16];
  _Alloc_hider local_1f50;
  char local_1f40 [16];
  _Alloc_hider local_1f30;
  size_type local_1f28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f20;
  int local_1f10;
  DictionaryLike local_1f08;
  DictionaryLike local_1eb0;
  undefined1 *local_1e58 [2];
  undefined1 local_1e48 [16];
  undefined1 *local_1e38 [2];
  undefined1 local_1e28 [16];
  undefined1 *local_1e18 [2];
  undefined1 local_1e08 [16];
  undefined1 *local_1df8 [2];
  undefined1 local_1de8 [16];
  undefined1 *local_1dd8 [2];
  undefined1 local_1dc8 [16];
  undefined4 *local_1db8;
  undefined8 local_1db0;
  undefined4 local_1da8;
  undefined1 local_1da4;
  undefined4 local_1d98;
  DictionaryLike local_1d90;
  DictionaryLike local_1d38;
  undefined1 *local_1ce0 [2];
  undefined1 local_1cd0 [16];
  undefined1 *local_1cc0 [2];
  undefined1 local_1cb0 [16];
  undefined1 *local_1ca0 [2];
  undefined1 local_1c90 [16];
  undefined1 *local_1c80 [2];
  undefined1 local_1c70 [16];
  undefined1 *local_1c60 [2];
  undefined1 local_1c50 [16];
  undefined4 *local_1c40;
  undefined8 local_1c38;
  undefined4 local_1c30;
  undefined1 local_1c2c;
  undefined4 local_1c20;
  DictionaryLike local_1c18;
  DictionaryLike local_1bc0;
  undefined1 *local_1b68 [2];
  undefined1 local_1b58 [16];
  undefined1 *local_1b48 [2];
  undefined1 local_1b38 [16];
  undefined1 *local_1b28 [2];
  undefined1 local_1b18 [16];
  undefined1 *local_1b08 [2];
  undefined1 local_1af8 [16];
  undefined1 *local_1ae8 [2];
  undefined1 local_1ad8 [16];
  undefined4 *local_1ac8;
  undefined8 local_1ac0;
  undefined4 local_1ab8;
  undefined1 local_1ab4;
  undefined4 local_1aa8;
  DictionaryLike local_1aa0;
  DictionaryLike local_1a48;
  undefined1 *local_19f0 [2];
  undefined1 local_19e0 [16];
  undefined1 *local_19d0 [2];
  undefined1 local_19c0 [16];
  undefined1 *local_19b0 [2];
  undefined1 local_19a0 [16];
  undefined1 *local_1990 [2];
  undefined1 local_1980 [16];
  undefined1 *local_1970 [2];
  undefined1 local_1960 [16];
  undefined4 *local_1950;
  undefined8 local_1948;
  undefined4 local_1940;
  undefined1 local_193c;
  undefined4 local_1930;
  DictionaryLike local_1928;
  DictionaryLike local_18d0;
  undefined1 *local_1878 [2];
  undefined1 local_1868 [16];
  undefined1 *local_1858 [2];
  undefined1 local_1848 [16];
  undefined1 *local_1838 [2];
  undefined1 local_1828 [16];
  undefined1 *local_1818 [2];
  undefined1 local_1808 [16];
  undefined1 *local_17f8 [2];
  undefined1 local_17e8 [16];
  undefined4 *local_17d8;
  undefined8 local_17d0;
  undefined4 local_17c8;
  undefined1 local_17c4;
  undefined4 local_17b8;
  DictionaryLike local_17b0;
  DictionaryLike local_1758;
  undefined1 *local_1700 [2];
  undefined1 local_16f0 [16];
  undefined1 *local_16e0 [2];
  undefined1 local_16d0 [16];
  undefined1 *local_16c0 [2];
  undefined1 local_16b0 [16];
  undefined1 *local_16a0 [2];
  undefined1 local_1690 [16];
  undefined1 *local_1680 [2];
  undefined1 local_1670 [16];
  undefined4 *local_1660;
  undefined8 local_1658;
  undefined4 local_1650;
  undefined1 local_164c;
  undefined4 local_1640;
  DictionaryLike local_1638;
  DictionaryLike local_15e0;
  undefined1 *local_1588 [2];
  undefined1 local_1578 [16];
  undefined1 *local_1568 [2];
  undefined1 local_1558 [16];
  undefined1 *local_1548 [2];
  undefined1 local_1538 [16];
  undefined1 *local_1528 [2];
  undefined1 local_1518 [16];
  undefined1 *local_1508 [2];
  undefined1 local_14f8 [16];
  undefined4 *local_14e8;
  undefined8 local_14e0;
  undefined4 local_14d8;
  undefined1 local_14d4;
  undefined4 local_14c8;
  DictionaryLike local_14c0;
  DictionaryLike local_1468;
  undefined1 *local_1410 [2];
  undefined1 local_1400 [16];
  undefined1 *local_13f0 [2];
  undefined1 local_13e0 [16];
  undefined1 *local_13d0 [2];
  undefined1 local_13c0 [16];
  undefined1 *local_13b0 [2];
  undefined1 local_13a0 [16];
  undefined1 *local_1390 [2];
  undefined1 local_1380 [16];
  undefined4 *local_1370;
  undefined8 local_1368;
  undefined4 local_1360;
  undefined1 local_135c;
  undefined4 local_1350;
  DictionaryLike local_1348;
  DictionaryLike local_12f0;
  undefined1 *local_1298 [2];
  undefined1 local_1288 [16];
  undefined1 *local_1278 [2];
  undefined1 local_1268 [16];
  undefined1 *local_1258 [2];
  undefined1 local_1248 [16];
  undefined1 *local_1238 [2];
  undefined1 local_1228 [16];
  undefined1 *local_1218 [2];
  undefined1 local_1208 [16];
  undefined4 *local_11f8;
  undefined8 local_11f0;
  undefined4 local_11e8;
  undefined1 local_11e4;
  undefined4 local_11d8;
  DictionaryLike local_11d0;
  DictionaryLike local_1178;
  undefined1 *local_1120 [2];
  undefined1 local_1110 [16];
  undefined1 *local_1100 [2];
  undefined1 local_10f0 [16];
  undefined1 *local_10e0 [2];
  undefined1 local_10d0 [16];
  undefined1 *local_10c0 [2];
  undefined1 local_10b0 [16];
  undefined1 *local_10a0 [2];
  undefined1 local_1090 [16];
  undefined4 *local_1080;
  undefined8 local_1078;
  undefined4 local_1070;
  undefined1 local_106c;
  undefined4 local_1060;
  DictionaryLike local_1058;
  DictionaryLike local_1000;
  undefined1 *local_fa8 [2];
  undefined1 local_f98 [16];
  undefined1 *local_f88 [2];
  undefined1 local_f78 [16];
  undefined1 *local_f68 [2];
  undefined1 local_f58 [16];
  undefined1 *local_f48 [2];
  undefined1 local_f38 [16];
  undefined1 *local_f28 [2];
  undefined1 local_f18 [16];
  undefined4 *local_f08;
  undefined8 local_f00;
  undefined4 local_ef8;
  undefined1 local_ef4;
  undefined4 local_ee8;
  DictionaryLike local_ee0;
  DictionaryLike local_e88;
  undefined1 *local_e30 [2];
  undefined1 local_e20 [16];
  undefined1 *local_e10 [2];
  undefined1 local_e00 [16];
  undefined1 *local_df0 [2];
  undefined1 local_de0 [16];
  undefined1 *local_dd0 [2];
  undefined1 local_dc0 [16];
  undefined1 *local_db0 [2];
  undefined1 local_da0 [16];
  undefined4 *local_d90;
  undefined8 local_d88;
  undefined4 local_d80;
  undefined1 local_d7c;
  undefined4 local_d70;
  DictionaryLike local_d68;
  DictionaryLike local_d10;
  undefined1 *local_cb8 [2];
  undefined1 local_ca8 [16];
  undefined1 *local_c98 [2];
  undefined1 local_c88 [16];
  undefined1 *local_c78 [2];
  undefined1 local_c68 [16];
  undefined1 *local_c58 [2];
  undefined1 local_c48 [16];
  undefined1 *local_c38 [2];
  undefined1 local_c28 [16];
  undefined4 *local_c18;
  undefined8 local_c10;
  undefined4 local_c08;
  undefined1 local_c04;
  undefined4 local_bf8;
  DictionaryLike local_bf0;
  DictionaryLike local_b98;
  undefined1 *local_b40 [2];
  undefined1 local_b30 [16];
  undefined1 *local_b20 [2];
  undefined1 local_b10 [16];
  undefined1 *local_b00 [2];
  undefined1 local_af0 [16];
  undefined1 *local_ae0 [2];
  undefined1 local_ad0 [16];
  undefined1 *local_ac0 [2];
  undefined1 local_ab0 [16];
  undefined4 *local_aa0;
  undefined8 local_a98;
  undefined4 local_a90;
  undefined1 local_a8c;
  undefined4 local_a80;
  DictionaryLike local_a78;
  DictionaryLike local_a20;
  undefined1 *local_9c8 [2];
  undefined1 local_9b8 [16];
  undefined1 *local_9a8 [2];
  undefined1 local_998 [16];
  undefined1 *local_988 [2];
  undefined1 local_978 [16];
  undefined1 *local_968 [2];
  undefined1 local_958 [16];
  undefined1 *local_948 [2];
  undefined1 local_938 [16];
  undefined1 *local_928 [2];
  undefined1 local_918 [16];
  undefined4 local_908;
  DictionaryLike local_900;
  DictionaryLike local_8a8;
  undefined1 *local_850 [2];
  undefined1 local_840 [16];
  undefined1 *local_830 [2];
  undefined1 local_820 [16];
  undefined1 *local_810 [2];
  undefined1 local_800 [16];
  undefined1 *local_7f0 [2];
  undefined1 local_7e0 [16];
  undefined1 *local_7d0 [2];
  undefined1 local_7c0 [16];
  undefined1 *local_7b0 [2];
  undefined1 local_7a0 [16];
  undefined4 local_790;
  DictionaryLike local_788;
  DictionaryLike local_730;
  undefined1 *local_6d8 [2];
  undefined1 local_6c8 [16];
  undefined1 *local_6b8 [2];
  undefined1 local_6a8 [16];
  undefined1 *local_698 [2];
  undefined1 local_688 [16];
  undefined1 *local_678 [2];
  undefined1 local_668 [16];
  undefined1 *local_658 [2];
  undefined1 local_648 [16];
  undefined4 *local_638;
  undefined8 local_630;
  undefined4 local_628;
  undefined1 local_624;
  undefined4 local_618;
  DictionaryLike local_610;
  DictionaryLike local_5b8;
  undefined1 *local_560 [2];
  undefined1 local_550 [16];
  undefined1 *local_540 [2];
  undefined1 local_530 [16];
  undefined1 *local_520 [2];
  undefined1 local_510 [16];
  undefined1 *local_500 [2];
  undefined1 local_4f0 [16];
  undefined1 *local_4e0 [2];
  undefined1 local_4d0 [16];
  undefined4 *local_4c0;
  undefined8 local_4b8;
  undefined4 local_4b0;
  undefined1 local_4ac;
  undefined4 local_4a0;
  DictionaryLike local_498;
  DictionaryLike local_440;
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [16];
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  undefined4 *local_348;
  undefined8 local_340;
  undefined4 local_338;
  undefined1 local_334;
  undefined4 local_328;
  DictionaryLike local_320;
  DictionaryLike local_2c8;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined4 *local_1d0;
  undefined8 local_1c8;
  undefined4 local_1c0;
  undefined1 local_1bc;
  undefined4 local_1b0;
  DictionaryLike local_1a8;
  DictionaryLike local_150;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined4 *local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined1 local_44;
  undefined4 local_38;
  
  local_2520._M_dataplus._M_p = (pointer)&local_2520.field_2;
  local_2520.field_2._M_allocated_capacity._0_4_ = 0x363132;
  local_2520._M_string_length = 3;
  DictionaryLike::DictionaryLike((DictionaryLike *)local_2080,&local_2520);
  local_2540._M_dataplus._M_p = (pointer)&local_2540.field_2;
  local_2540.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_2540._M_string_length = 2;
  local_2540.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike((DictionaryLike *)(local_2080 + 0x58),&local_2540);
  local_1fd0._M_p = local_1fc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1fd0,"6000d000.gpio","");
  local_1fb0._M_p = local_1fa0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1fb0,"7","");
  local_1f90._M_p = local_1f80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f90,"4","");
  local_1f70._M_p = local_1f60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f70,"GPIO9","");
  local_1f50._M_p = local_1f40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f50,"AUD_MCLK","");
  local_1f30._M_p = (pointer)&local_1f20;
  local_1f20._M_allocated_capacity._0_4_ = 0x656e6f4e;
  local_1f28 = 4;
  local_1f20._M_local_buf[4] = '\0';
  local_1f10 = -1;
  local_2560._M_dataplus._M_p = (pointer)&local_2560.field_2;
  local_2560.field_2._M_allocated_capacity._0_2_ = 0x3035;
  local_2560._M_string_length = 2;
  local_2560.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_1f08,&local_2560);
  local_2580._M_dataplus._M_p = (pointer)&local_2580.field_2;
  local_2580.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_2580._M_string_length = 2;
  local_2580.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_1eb0,&local_2580);
  local_1e58[0] = local_1e48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e58,"6000d000.gpio","");
  local_1e38[0] = local_1e28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e38,"11","");
  local_1e18[0] = local_1e08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e18,"17","");
  local_1df8[0] = local_1de8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1df8,"UART1_RTS","");
  local_1dd8[0] = local_1dc8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1dd8,"UART2_RTS","");
  local_1db8 = &local_1da8;
  local_1da8 = 0x656e6f4e;
  local_1db0 = 4;
  local_1da4 = 0;
  local_1d98 = 0xffffffff;
  local_25a0._M_dataplus._M_p = (pointer)&local_25a0.field_2;
  local_25a0.field_2._M_allocated_capacity._0_2_ = 0x3937;
  local_25a0._M_string_length = 2;
  local_25a0.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_1d90,&local_25a0);
  local_25c0._M_dataplus._M_p = (pointer)&local_25c0.field_2;
  local_25c0.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_25c0._M_string_length = 2;
  local_25c0.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_1d38,&local_25c0);
  local_1ce0[0] = local_1cd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1ce0,"6000d000.gpio","");
  local_1cc0[0] = local_1cb0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1cc0,"12","");
  local_1ca0[0] = local_1c90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1ca0,"18","");
  local_1c80[0] = local_1c70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c80,"I2S0_SCLK","");
  local_1c60[0] = local_1c50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c60,"DAP4_SCLK","");
  local_1c40 = &local_1c30;
  local_1c30 = 0x656e6f4e;
  local_1c38 = 4;
  local_1c2c = 0;
  local_1c20 = 0xffffffff;
  local_25e0._M_dataplus._M_p = (pointer)&local_25e0.field_2;
  local_25e0.field_2._M_allocated_capacity._0_2_ = 0x3431;
  local_25e0._M_string_length = 2;
  local_25e0.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_1c18,&local_25e0);
  local_2600._M_dataplus._M_p = (pointer)&local_2600.field_2;
  local_2600.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_2600._M_string_length = 2;
  local_2600.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_1bc0,&local_2600);
  local_1b68[0] = local_1b58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b68,"6000d000.gpio","");
  local_1b48[0] = local_1b38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b48,"13","");
  local_1b28[0] = local_1b18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b28,"27","");
  local_1b08[0] = local_1af8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b08,"SPI1_SCK","");
  local_1ae8[0] = local_1ad8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1ae8,"SPI2_SCK","");
  local_1ac8 = &local_1ab8;
  local_1ab8 = 0x656e6f4e;
  local_1ac0 = 4;
  local_1ab4 = 0;
  local_1aa8 = 0xffffffff;
  local_24e0._M_dataplus._M_p = (pointer)&local_24e0.field_2;
  local_24e0.field_2._M_allocated_capacity._0_4_ = 0x343931;
  local_24e0._M_string_length = 3;
  DictionaryLike::DictionaryLike(&local_1aa0,&local_24e0);
  local_2500._M_dataplus._M_p = (pointer)&local_2500.field_2;
  local_2500.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_2500._M_string_length = 2;
  local_2500.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_1a48,&local_2500);
  local_19f0[0] = local_19e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_19f0,"6000d000.gpio","");
  local_19d0[0] = local_19c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_19d0,"15","");
  local_19b0[0] = local_19a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_19b0,"22","");
  local_1990[0] = local_1980;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1990,"GPIO12","");
  local_1970[0] = local_1960;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1970,"LCD_TE","");
  local_1950 = &local_1940;
  local_1940 = 0x656e6f4e;
  local_1948 = 4;
  local_193c = 0;
  local_1930 = 0xffffffff;
  local_20e0._M_dataplus._M_p = (pointer)&local_20e0.field_2;
  local_20e0.field_2._M_allocated_capacity._0_4_ = 0x323332;
  local_20e0._M_string_length = 3;
  DictionaryLike::DictionaryLike(&local_1928,&local_20e0);
  local_2100._M_dataplus._M_p = (pointer)&local_2100.field_2;
  local_2100.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_2100._M_string_length = 2;
  local_2100.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_18d0,&local_2100);
  local_1878[0] = local_1868;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1878,"6000d000.gpio","");
  local_1858[0] = local_1848;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1858,"16","");
  local_1838[0] = local_1828;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1838,"23","");
  local_1818[0] = local_1808;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1818,"SPI1_CS1","");
  local_17f8[0] = local_17e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_17f8,"SPI2_CS1","");
  local_17d8 = &local_17c8;
  local_17c8 = 0x656e6f4e;
  local_17d0 = 4;
  local_17c4 = 0;
  local_17b8 = 0xffffffff;
  local_2120._M_dataplus._M_p = (pointer)&local_2120.field_2;
  local_2120.field_2._M_allocated_capacity._0_2_ = 0x3531;
  local_2120._M_string_length = 2;
  local_2120.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_17b0,&local_2120);
  local_2140._M_dataplus._M_p = (pointer)&local_2140.field_2;
  local_2140.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_2140._M_string_length = 2;
  local_2140.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_1758,&local_2140);
  local_1700[0] = local_16f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1700,"6000d000.gpio","");
  local_16e0[0] = local_16d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_16e0,"18","");
  local_16c0[0] = local_16b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_16c0,"24","");
  local_16a0[0] = local_1690;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_16a0,"SPI1_CS0","");
  local_1680[0] = local_1670;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1680,"SPI2_CS0","");
  local_1660 = &local_1650;
  local_1650 = 0x656e6f4e;
  local_1658 = 4;
  local_164c = 0;
  local_1640 = 0xffffffff;
  local_2160._M_dataplus._M_p = (pointer)&local_2160.field_2;
  local_2160.field_2._M_allocated_capacity._0_2_ = 0x3631;
  local_2160._M_string_length = 2;
  local_2160.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_1638,&local_2160);
  local_2180._M_dataplus._M_p = (pointer)&local_2180.field_2;
  local_2180.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_2180._M_string_length = 2;
  local_2180.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_15e0,&local_2180);
  local_1588[0] = local_1578;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1588,"6000d000.gpio","");
  local_1568[0] = local_1558;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1568,"19","");
  local_1548[0] = local_1538;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1548,"10","");
  local_1528[0] = local_1518;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1528,"SPI0_MOSI","");
  local_1508[0] = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"SPI1_MOSI","");
  local_14e8 = &local_14d8;
  local_14d8 = 0x656e6f4e;
  local_14e0 = 4;
  local_14d4 = 0;
  local_14c8 = 0xffffffff;
  local_21a0._M_dataplus._M_p = (pointer)&local_21a0.field_2;
  local_21a0.field_2._M_allocated_capacity._0_2_ = 0x3731;
  local_21a0._M_string_length = 2;
  local_21a0.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_14c0,&local_21a0);
  local_21c0._M_dataplus._M_p = (pointer)&local_21c0.field_2;
  local_21c0.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_21c0._M_string_length = 2;
  local_21c0.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_1468,&local_21c0);
  local_1410[0] = local_1400;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1410,"6000d000.gpio","");
  local_13f0[0] = local_13e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13f0,"21","");
  local_13d0[0] = local_13c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13d0,"9","");
  local_13b0[0] = local_13a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13b0,"SPI0_MISO","");
  local_1390[0] = local_1380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1390,"SPI1_MISO","");
  local_1370 = &local_1360;
  local_1360 = 0x656e6f4e;
  local_1368 = 4;
  local_135c = 0;
  local_1350 = 0xffffffff;
  local_21e0._M_dataplus._M_p = (pointer)&local_21e0.field_2;
  local_21e0.field_2._M_allocated_capacity._0_2_ = 0x3331;
  local_21e0._M_string_length = 2;
  local_21e0.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_1348,&local_21e0);
  local_2200._M_dataplus._M_p = (pointer)&local_2200.field_2;
  local_2200.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_2200._M_string_length = 2;
  local_2200.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_12f0,&local_2200);
  local_1298[0] = local_1288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1298,"6000d000.gpio","");
  local_1278[0] = local_1268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1278,"22","");
  local_1258[0] = local_1248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1258,"25","");
  local_1238[0] = local_1228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1238,"SPI1_MISO","");
  local_1218[0] = local_1208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1218,"SPI2_MISO","");
  local_11f8 = &local_11e8;
  local_11e8 = 0x656e6f4e;
  local_11f0 = 4;
  local_11e4 = 0;
  local_11d8 = 0xffffffff;
  local_2220._M_dataplus._M_p = (pointer)&local_2220.field_2;
  local_2220.field_2._M_allocated_capacity._0_2_ = 0x3831;
  local_2220._M_string_length = 2;
  local_2220.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_11d0,&local_2220);
  local_2240._M_dataplus._M_p = (pointer)&local_2240.field_2;
  local_2240.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_2240._M_string_length = 2;
  local_2240.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_1178,&local_2240);
  local_1120[0] = local_1110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1120,"6000d000.gpio","");
  local_1100[0] = local_10f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1100,"23","");
  local_10e0[0] = local_10d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10e0,"11","");
  local_10c0[0] = local_10b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10c0,"SPI0_SCK","");
  local_10a0[0] = local_1090;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10a0,"SPI1_SCK","");
  local_1080 = &local_1070;
  local_1070 = 0x656e6f4e;
  local_1078 = 4;
  local_106c = 0;
  local_1060 = 0xffffffff;
  local_2260._M_dataplus._M_p = (pointer)&local_2260.field_2;
  local_2260.field_2._M_allocated_capacity._0_2_ = 0x3931;
  local_2260._M_string_length = 2;
  local_2260.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_1058,&local_2260);
  local_2280._M_dataplus._M_p = (pointer)&local_2280.field_2;
  local_2280.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_2280._M_string_length = 2;
  local_2280.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_1000,&local_2280);
  local_fa8[0] = local_f98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fa8,"6000d000.gpio","");
  local_f88[0] = local_f78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f88,"24","");
  local_f68[0] = local_f58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f68,"8","");
  local_f48[0] = local_f38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f48,"SPI0_CS0","");
  local_f28[0] = local_f18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f28,"SPI1_CS0","");
  local_f08 = &local_ef8;
  local_ef8 = 0x656e6f4e;
  local_f00 = 4;
  local_ef4 = 0;
  local_ee8 = 0xffffffff;
  local_22a0._M_dataplus._M_p = (pointer)&local_22a0.field_2;
  local_22a0.field_2._M_allocated_capacity._0_2_ = 0x3032;
  local_22a0._M_string_length = 2;
  local_22a0.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_ee0,&local_22a0);
  local_22c0._M_dataplus._M_p = (pointer)&local_22c0.field_2;
  local_22c0.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_22c0._M_string_length = 2;
  local_22c0.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_e88,&local_22c0);
  local_e30[0] = local_e20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e30,"6000d000.gpio","");
  local_e10[0] = local_e00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e10,"26","");
  local_df0[0] = local_de0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_df0,"7","");
  local_dd0[0] = local_dc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_dd0,"SPI0_CS1","");
  local_db0[0] = local_da0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_db0,"SPI1_CS1","");
  local_d90 = &local_d80;
  local_d80 = 0x656e6f4e;
  local_d88 = 4;
  local_d7c = 0;
  local_d70 = 0xffffffff;
  local_22e0._M_dataplus._M_p = (pointer)&local_22e0.field_2;
  local_22e0.field_2._M_allocated_capacity._0_4_ = 0x393431;
  local_22e0._M_string_length = 3;
  DictionaryLike::DictionaryLike(&local_d68,&local_22e0);
  local_2300._M_dataplus._M_p = (pointer)&local_2300.field_2;
  local_2300.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_2300._M_string_length = 2;
  local_2300.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_d10,&local_2300);
  local_cb8[0] = local_ca8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cb8,"6000d000.gpio","");
  local_c98[0] = local_c88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c98,"29","");
  local_c78[0] = local_c68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c78,"5","");
  local_c58[0] = local_c48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c58,"GPIO01","");
  local_c38[0] = local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"CAM_AF_EN","");
  local_c18 = &local_c08;
  local_c08 = 0x656e6f4e;
  local_c10 = 4;
  local_c04 = 0;
  local_bf8 = 0xffffffff;
  local_2320._M_dataplus._M_p = (pointer)&local_2320.field_2;
  local_2320.field_2._M_allocated_capacity._0_4_ = 0x303032;
  local_2320._M_string_length = 3;
  DictionaryLike::DictionaryLike(&local_bf0,&local_2320);
  local_2340._M_dataplus._M_p = (pointer)&local_2340.field_2;
  local_2340.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_2340._M_string_length = 2;
  local_2340.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_b98,&local_2340);
  local_b40[0] = local_b30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b40,"6000d000.gpio","");
  local_b20[0] = local_b10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b20,"31","");
  local_b00[0] = local_af0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b00,"6","");
  local_ae0[0] = local_ad0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae0,"GPIO11","");
  local_ac0[0] = local_ab0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac0,"GPIO_PZ0","");
  local_aa0 = &local_a90;
  local_a90 = 0x656e6f4e;
  local_a98 = 4;
  local_a8c = 0;
  local_a80 = 0xffffffff;
  local_2360._M_dataplus._M_p = (pointer)&local_2360.field_2;
  local_2360.field_2._M_allocated_capacity._0_4_ = 0x383631;
  local_2360._M_string_length = 3;
  DictionaryLike::DictionaryLike(&local_a78,&local_2360);
  local_2380._M_dataplus._M_p = (pointer)&local_2380.field_2;
  local_2380.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_2380._M_string_length = 2;
  local_2380.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_a20,&local_2380);
  local_9c8[0] = local_9b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9c8,"6000d000.gpio","");
  local_9a8[0] = local_998;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,"32","");
  local_988[0] = local_978;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_988,"12","");
  local_968[0] = local_958;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_968,"GPIO07","");
  local_948[0] = local_938;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"LCD_BL_PW","");
  local_928[0] = local_918;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"7000a000.pwm","");
  local_908 = 0;
  local_23a0._M_dataplus._M_p = (pointer)&local_23a0.field_2;
  local_23a0.field_2._M_allocated_capacity._0_2_ = 0x3833;
  local_23a0._M_string_length = 2;
  local_23a0.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_900,&local_23a0);
  local_23c0._M_dataplus._M_p = (pointer)&local_23c0.field_2;
  local_23c0.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_23c0._M_string_length = 2;
  local_23c0.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_8a8,&local_23c0);
  local_850[0] = local_840;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_850,"6000d000.gpio","");
  local_830[0] = local_820;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"33","");
  local_810[0] = local_800;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_810,"13","");
  local_7f0[0] = local_7e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7f0,"GPIO13","");
  local_7d0[0] = local_7c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7d0,"GPIO_PE6","");
  local_7b0[0] = local_7a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7b0,"7000a000.pwm","");
  local_790 = 2;
  local_23e0._M_dataplus._M_p = (pointer)&local_23e0.field_2;
  local_23e0.field_2._M_allocated_capacity._0_2_ = 0x3637;
  local_23e0._M_string_length = 2;
  local_23e0.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_788,&local_23e0);
  local_2400._M_dataplus._M_p = (pointer)&local_2400.field_2;
  local_2400.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_2400._M_string_length = 2;
  local_2400.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_730,&local_2400);
  local_6d8[0] = local_6c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"6000d000.gpio","");
  local_6b8[0] = local_6a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6b8,"35","");
  local_698[0] = local_688;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"19","");
  local_678[0] = local_668;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"I2S0_FS","");
  local_658[0] = local_648;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"DAP4_FS","");
  local_638 = &local_628;
  local_628 = 0x656e6f4e;
  local_630 = 4;
  local_624 = 0;
  local_618 = 0xffffffff;
  local_2420._M_dataplus._M_p = (pointer)&local_2420.field_2;
  local_2420.field_2._M_allocated_capacity._0_2_ = 0x3135;
  local_2420._M_string_length = 2;
  local_2420.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_610,&local_2420);
  local_2440._M_dataplus._M_p = (pointer)&local_2440.field_2;
  local_2440.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_2440._M_string_length = 2;
  local_2440.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_5b8,&local_2440);
  local_560[0] = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_560,"6000d000.gpio","");
  local_540[0] = local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"36","");
  local_520[0] = local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"16","");
  local_500[0] = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"UART1_CTS","");
  local_4e0[0] = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"UART2_CTS","");
  local_4c0 = &local_4b0;
  local_4b0 = 0x656e6f4e;
  local_4b8 = 4;
  local_4ac = 0;
  local_4a0 = 0xffffffff;
  local_2460._M_dataplus._M_p = (pointer)&local_2460.field_2;
  local_2460.field_2._M_allocated_capacity._0_2_ = 0x3231;
  local_2460._M_string_length = 2;
  local_2460.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_498,&local_2460);
  local_2480._M_dataplus._M_p = (pointer)&local_2480.field_2;
  local_2480.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_2480._M_string_length = 2;
  local_2480.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_440,&local_2480);
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"6000d000.gpio","");
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"37","");
  local_3a8[0] = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"26","");
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"SPI1_MOSI","");
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"SPI2_MOSI","");
  local_348 = &local_338;
  local_338 = 0x656e6f4e;
  local_340 = 4;
  local_334 = 0;
  local_328 = 0xffffffff;
  local_24a0._M_dataplus._M_p = (pointer)&local_24a0.field_2;
  local_24a0.field_2._M_allocated_capacity._0_2_ = 0x3737;
  local_24a0._M_string_length = 2;
  local_24a0.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_320,&local_24a0);
  local_24c0._M_dataplus._M_p = (pointer)&local_24c0.field_2;
  local_24c0.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_24c0._M_string_length = 2;
  local_24c0.field_2._M_local_buf[2] = '\0';
  DictionaryLike::DictionaryLike(&local_2c8,&local_24c0);
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"6000d000.gpio","");
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"38","");
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"20","");
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"I2S0_DIN","");
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"DAP4_DIN","");
  local_1d0 = &local_1c0;
  local_1c0 = 0x656e6f4e;
  local_1c8 = 4;
  local_1bc = 0;
  local_1b0 = 0xffffffff;
  local_20a0.field_2._M_allocated_capacity._0_2_ = 0x3837;
  local_20a0._M_string_length = 2;
  local_20a0.field_2._M_local_buf[2] = '\0';
  local_20a0._M_dataplus._M_p = (pointer)&local_20a0.field_2;
  DictionaryLike::DictionaryLike(&local_1a8,&local_20a0);
  local_20c0.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_20c0._M_string_length = 2;
  local_20c0.field_2._M_local_buf[2] = '\0';
  local_20c0._M_dataplus._M_p = (pointer)&local_20c0.field_2;
  DictionaryLike::DictionaryLike(&local_150,&local_20c0);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"6000d000.gpio","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"40","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"21","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"I2S0_DOUT","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"DAP4_DOUT","");
  local_58 = &local_48;
  local_48 = 0x656e6f4e;
  local_50 = 4;
  local_44 = 0;
  local_38 = 0xffffffff;
  __l._M_len = 0x16;
  __l._M_array = (iterator)local_2080;
  std::vector<GPIO::PinDefinition,_std::allocator<GPIO::PinDefinition>_>::vector
            (in_RDI,__l,&local_2601);
  lVar1 = 0x1ed8;
  do {
    PinDefinition::~PinDefinition((PinDefinition *)(local_2080 + lVar1));
    lVar1 = lVar1 + -0x178;
  } while (lVar1 != -0x178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_20c0._M_dataplus._M_p != &local_20c0.field_2) {
    operator_delete(local_20c0._M_dataplus._M_p,
                    CONCAT53(local_20c0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_20c0.field_2._M_local_buf[2],
                                      local_20c0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_20a0._M_dataplus._M_p != &local_20a0.field_2) {
    operator_delete(local_20a0._M_dataplus._M_p,
                    CONCAT53(local_20a0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_20a0.field_2._M_local_buf[2],
                                      local_20a0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_24c0._M_dataplus._M_p != &local_24c0.field_2) {
    operator_delete(local_24c0._M_dataplus._M_p,
                    CONCAT53(local_24c0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_24c0.field_2._M_local_buf[2],
                                      local_24c0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_24a0._M_dataplus._M_p != &local_24a0.field_2) {
    operator_delete(local_24a0._M_dataplus._M_p,
                    CONCAT53(local_24a0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_24a0.field_2._M_local_buf[2],
                                      local_24a0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2480._M_dataplus._M_p != &local_2480.field_2) {
    operator_delete(local_2480._M_dataplus._M_p,
                    CONCAT53(local_2480.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2480.field_2._M_local_buf[2],
                                      local_2480.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2460._M_dataplus._M_p != &local_2460.field_2) {
    operator_delete(local_2460._M_dataplus._M_p,
                    CONCAT53(local_2460.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2460.field_2._M_local_buf[2],
                                      local_2460.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2440._M_dataplus._M_p != &local_2440.field_2) {
    operator_delete(local_2440._M_dataplus._M_p,
                    CONCAT53(local_2440.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2440.field_2._M_local_buf[2],
                                      local_2440.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2420._M_dataplus._M_p != &local_2420.field_2) {
    operator_delete(local_2420._M_dataplus._M_p,
                    CONCAT53(local_2420.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2420.field_2._M_local_buf[2],
                                      local_2420.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2400._M_dataplus._M_p != &local_2400.field_2) {
    operator_delete(local_2400._M_dataplus._M_p,
                    CONCAT53(local_2400.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2400.field_2._M_local_buf[2],
                                      local_2400.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_23e0._M_dataplus._M_p != &local_23e0.field_2) {
    operator_delete(local_23e0._M_dataplus._M_p,
                    CONCAT53(local_23e0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_23e0.field_2._M_local_buf[2],
                                      local_23e0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_23c0._M_dataplus._M_p != &local_23c0.field_2) {
    operator_delete(local_23c0._M_dataplus._M_p,
                    CONCAT53(local_23c0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_23c0.field_2._M_local_buf[2],
                                      local_23c0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_23a0._M_dataplus._M_p != &local_23a0.field_2) {
    operator_delete(local_23a0._M_dataplus._M_p,
                    CONCAT53(local_23a0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_23a0.field_2._M_local_buf[2],
                                      local_23a0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2380._M_dataplus._M_p != &local_2380.field_2) {
    operator_delete(local_2380._M_dataplus._M_p,
                    CONCAT53(local_2380.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2380.field_2._M_local_buf[2],
                                      local_2380.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2360._M_dataplus._M_p != &local_2360.field_2) {
    operator_delete(local_2360._M_dataplus._M_p,
                    CONCAT44(local_2360.field_2._M_allocated_capacity._4_4_,
                             local_2360.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2340._M_dataplus._M_p != &local_2340.field_2) {
    operator_delete(local_2340._M_dataplus._M_p,
                    CONCAT53(local_2340.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2340.field_2._M_local_buf[2],
                                      local_2340.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2320._M_dataplus._M_p != &local_2320.field_2) {
    operator_delete(local_2320._M_dataplus._M_p,
                    CONCAT44(local_2320.field_2._M_allocated_capacity._4_4_,
                             local_2320.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2300._M_dataplus._M_p != &local_2300.field_2) {
    operator_delete(local_2300._M_dataplus._M_p,
                    CONCAT53(local_2300.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2300.field_2._M_local_buf[2],
                                      local_2300.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_22e0._M_dataplus._M_p != &local_22e0.field_2) {
    operator_delete(local_22e0._M_dataplus._M_p,
                    CONCAT44(local_22e0.field_2._M_allocated_capacity._4_4_,
                             local_22e0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_22c0._M_dataplus._M_p != &local_22c0.field_2) {
    operator_delete(local_22c0._M_dataplus._M_p,
                    CONCAT53(local_22c0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_22c0.field_2._M_local_buf[2],
                                      local_22c0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_22a0._M_dataplus._M_p != &local_22a0.field_2) {
    operator_delete(local_22a0._M_dataplus._M_p,
                    CONCAT53(local_22a0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_22a0.field_2._M_local_buf[2],
                                      local_22a0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2280._M_dataplus._M_p != &local_2280.field_2) {
    operator_delete(local_2280._M_dataplus._M_p,
                    CONCAT53(local_2280.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2280.field_2._M_local_buf[2],
                                      local_2280.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2260._M_dataplus._M_p != &local_2260.field_2) {
    operator_delete(local_2260._M_dataplus._M_p,
                    CONCAT53(local_2260.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2260.field_2._M_local_buf[2],
                                      local_2260.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2240._M_dataplus._M_p != &local_2240.field_2) {
    operator_delete(local_2240._M_dataplus._M_p,
                    CONCAT53(local_2240.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2240.field_2._M_local_buf[2],
                                      local_2240.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2220._M_dataplus._M_p != &local_2220.field_2) {
    operator_delete(local_2220._M_dataplus._M_p,
                    CONCAT53(local_2220.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2220.field_2._M_local_buf[2],
                                      local_2220.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2200._M_dataplus._M_p != &local_2200.field_2) {
    operator_delete(local_2200._M_dataplus._M_p,
                    CONCAT53(local_2200.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2200.field_2._M_local_buf[2],
                                      local_2200.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_21e0._M_dataplus._M_p != &local_21e0.field_2) {
    operator_delete(local_21e0._M_dataplus._M_p,
                    CONCAT53(local_21e0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_21e0.field_2._M_local_buf[2],
                                      local_21e0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_21c0._M_dataplus._M_p != &local_21c0.field_2) {
    operator_delete(local_21c0._M_dataplus._M_p,
                    CONCAT53(local_21c0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_21c0.field_2._M_local_buf[2],
                                      local_21c0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_21a0._M_dataplus._M_p != &local_21a0.field_2) {
    operator_delete(local_21a0._M_dataplus._M_p,
                    CONCAT53(local_21a0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_21a0.field_2._M_local_buf[2],
                                      local_21a0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2180._M_dataplus._M_p != &local_2180.field_2) {
    operator_delete(local_2180._M_dataplus._M_p,
                    CONCAT53(local_2180.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2180.field_2._M_local_buf[2],
                                      local_2180.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2160._M_dataplus._M_p != &local_2160.field_2) {
    operator_delete(local_2160._M_dataplus._M_p,
                    CONCAT53(local_2160.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2160.field_2._M_local_buf[2],
                                      local_2160.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2140._M_dataplus._M_p != &local_2140.field_2) {
    operator_delete(local_2140._M_dataplus._M_p,
                    CONCAT53(local_2140.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2140.field_2._M_local_buf[2],
                                      local_2140.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2120._M_dataplus._M_p != &local_2120.field_2) {
    operator_delete(local_2120._M_dataplus._M_p,
                    CONCAT53(local_2120.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2120.field_2._M_local_buf[2],
                                      local_2120.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2100._M_dataplus._M_p != &local_2100.field_2) {
    operator_delete(local_2100._M_dataplus._M_p,
                    CONCAT53(local_2100.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2100.field_2._M_local_buf[2],
                                      local_2100.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_20e0._M_dataplus._M_p != &local_20e0.field_2) {
    operator_delete(local_20e0._M_dataplus._M_p,
                    CONCAT44(local_20e0.field_2._M_allocated_capacity._4_4_,
                             local_20e0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2500._M_dataplus._M_p != &local_2500.field_2) {
    operator_delete(local_2500._M_dataplus._M_p,
                    CONCAT53(local_2500.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2500.field_2._M_local_buf[2],
                                      local_2500.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_24e0._M_dataplus._M_p != &local_24e0.field_2) {
    operator_delete(local_24e0._M_dataplus._M_p,
                    CONCAT44(local_24e0.field_2._M_allocated_capacity._4_4_,
                             local_24e0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2600._M_dataplus._M_p != &local_2600.field_2) {
    operator_delete(local_2600._M_dataplus._M_p,
                    CONCAT53(local_2600.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2600.field_2._M_local_buf[2],
                                      local_2600.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25e0._M_dataplus._M_p != &local_25e0.field_2) {
    operator_delete(local_25e0._M_dataplus._M_p,
                    CONCAT53(local_25e0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_25e0.field_2._M_local_buf[2],
                                      local_25e0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25c0._M_dataplus._M_p != &local_25c0.field_2) {
    operator_delete(local_25c0._M_dataplus._M_p,
                    CONCAT53(local_25c0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_25c0.field_2._M_local_buf[2],
                                      local_25c0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25a0._M_dataplus._M_p != &local_25a0.field_2) {
    operator_delete(local_25a0._M_dataplus._M_p,
                    CONCAT53(local_25a0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_25a0.field_2._M_local_buf[2],
                                      local_25a0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2580._M_dataplus._M_p != &local_2580.field_2) {
    operator_delete(local_2580._M_dataplus._M_p,
                    CONCAT53(local_2580.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2580.field_2._M_local_buf[2],
                                      local_2580.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2560._M_dataplus._M_p != &local_2560.field_2) {
    operator_delete(local_2560._M_dataplus._M_p,
                    CONCAT53(local_2560.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2560.field_2._M_local_buf[2],
                                      local_2560.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2540._M_dataplus._M_p != &local_2540.field_2) {
    operator_delete(local_2540._M_dataplus._M_p,
                    CONCAT53(local_2540.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_2540.field_2._M_local_buf[2],
                                      local_2540.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2520._M_dataplus._M_p != &local_2520.field_2) {
    operator_delete(local_2520._M_dataplus._M_p,
                    CONCAT44(local_2520.field_2._M_allocated_capacity._4_4_,
                             local_2520.field_2._M_allocated_capacity._0_4_) + 1);
  }
  return in_RDI;
}

Assistant:

static vector<PinDefinition> _JETSON_NANO_PIN_DEFS()
        {
            return {
                { "216"s, "{}"s, "6000d000.gpio", "7", "4",   "GPIO9",     "AUD_MCLK",  None,        None },
                { "50"s,  "{}"s, "6000d000.gpio", "11", "17", "UART1_RTS", "UART2_RTS", None,        None },
                { "79"s,  "{}"s, "6000d000.gpio", "12", "18", "I2S0_SCLK", "DAP4_SCLK", None,        None },
                { "14"s,  "{}"s, "6000d000.gpio", "13", "27", "SPI1_SCK",  "SPI2_SCK",  None,        None },
                { "194"s, "{}"s, "6000d000.gpio", "15", "22", "GPIO12",    "LCD_TE",    None,        None },
                { "232"s, "{}"s, "6000d000.gpio", "16", "23", "SPI1_CS1",  "SPI2_CS1",  None,        None },
                { "15"s,  "{}"s, "6000d000.gpio", "18", "24", "SPI1_CS0",  "SPI2_CS0",  None,        None },
                { "16"s,  "{}"s, "6000d000.gpio", "19", "10", "SPI0_MOSI", "SPI1_MOSI", None,        None },
                { "17"s,  "{}"s, "6000d000.gpio", "21", "9",  "SPI0_MISO", "SPI1_MISO", None,        None },
                { "13"s,  "{}"s, "6000d000.gpio", "22", "25", "SPI1_MISO", "SPI2_MISO", None,        None },
                { "18"s,  "{}"s, "6000d000.gpio", "23", "11", "SPI0_SCK",  "SPI1_SCK",  None,        None },
                { "19"s,  "{}"s, "6000d000.gpio", "24", "8",  "SPI0_CS0",  "SPI1_CS0",  None,        None },
                { "20"s,  "{}"s, "6000d000.gpio", "26", "7",  "SPI0_CS1",  "SPI1_CS1",  None,        None },
                { "149"s, "{}"s, "6000d000.gpio", "29", "5",  "GPIO01",    "CAM_AF_EN", None,        None },
                { "200"s, "{}"s, "6000d000.gpio", "31", "6",  "GPIO11",    "GPIO_PZ0",  None,        None },
                // Older versions of L4T have a DT bug which instantiates a bogus device
                // which prevents this library from using this PWM channel.
                { "168"s, "{}"s, "6000d000.gpio", "32", "12", "GPIO07",    "LCD_BL_PW", "7000a000.pwm", 0 },
                { "38"s,  "{}"s, "6000d000.gpio", "33", "13", "GPIO13",    "GPIO_PE6",  "7000a000.pwm", 2 },
                { "76"s,  "{}"s, "6000d000.gpio", "35", "19", "I2S0_FS",   "DAP4_FS",   None,        None },
                { "51"s,  "{}"s, "6000d000.gpio", "36", "16", "UART1_CTS", "UART2_CTS", None,        None },
                { "12"s,  "{}"s, "6000d000.gpio", "37", "26", "SPI1_MOSI", "SPI2_MOSI", None,        None },
                { "77"s,  "{}"s, "6000d000.gpio", "38", "20", "I2S0_DIN",  "DAP4_DIN",  None,        None },
                { "78"s,  "{}"s, "6000d000.gpio", "40", "21", "I2S0_DOUT", "DAP4_DOUT", None,        None }
            };
        }